

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

EVP_PKEY * EVP_PKCS82PKEY(PKCS8_PRIV_KEY_INFO *p8)

{
  EVP_PKEY *pkey;
  size_t sVar1;
  EVP_PKEY *ret;
  CBS cbs;
  uint8_t *puStack_20;
  int der_len;
  uint8_t *der;
  PKCS8_PRIV_KEY_INFO *p8_local;
  
  puStack_20 = (uint8_t *)0x0;
  der = (uint8_t *)p8;
  cbs.len._4_4_ = i2d_PKCS8_PRIV_KEY_INFO(p8,&stack0xffffffffffffffe0);
  if (-1 < cbs.len._4_4_) {
    CBS_init((CBS *)&ret,puStack_20,(long)cbs.len._4_4_);
    pkey = (EVP_PKEY *)EVP_parse_private_key((CBS *)&ret);
    if ((pkey != (EVP_PKEY *)0x0) && (sVar1 = CBS_len((CBS *)&ret), sVar1 == 0)) {
      OPENSSL_free(puStack_20);
      return pkey;
    }
    ERR_put_error(0x13,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x4a);
    EVP_PKEY_free(pkey);
    OPENSSL_free(puStack_20);
  }
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_PKCS82PKEY(const PKCS8_PRIV_KEY_INFO *p8) {
  uint8_t *der = NULL;
  int der_len = i2d_PKCS8_PRIV_KEY_INFO(p8, &der);
  if (der_len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, der, (size_t)der_len);
  EVP_PKEY *ret = EVP_parse_private_key(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    EVP_PKEY_free(ret);
    OPENSSL_free(der);
    return NULL;
  }

  OPENSSL_free(der);
  return ret;
}